

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O1

DH * DSA_dup_DH(DSA *r)

{
  int iVar1;
  DH *dh;
  BIGNUM *pBVar2;
  DH *pDVar3;
  
  if (r == (DSA *)0x0) {
    return (DH *)0x0;
  }
  dh = DH_new();
  if (dh == (DH *)0x0) {
LAB_0031c515:
    pDVar3 = (DH *)0x0;
  }
  else {
    if ((BIGNUM *)r->version != (BIGNUM *)0x0) {
      iVar1 = BN_num_bits((BIGNUM *)r->version);
      *(int *)&dh->priv_key = iVar1;
      pBVar2 = BN_dup((BIGNUM *)r->version);
      dh->g = pBVar2;
      if (pBVar2 == (BIGNUM *)0x0) goto LAB_0031c515;
    }
    if (*(BIGNUM **)r != (BIGNUM *)0x0) {
      pBVar2 = BN_dup(*(BIGNUM **)r);
      *(BIGNUM **)dh = pBVar2;
      if (pBVar2 == (BIGNUM *)0x0) goto LAB_0031c515;
    }
    if (*(BIGNUM **)&r->write_params != (BIGNUM *)0x0) {
      pBVar2 = BN_dup(*(BIGNUM **)&r->write_params);
      dh->p = pBVar2;
      if (pBVar2 == (BIGNUM *)0x0) goto LAB_0031c515;
    }
    if (r->p != (BIGNUM *)0x0) {
      pBVar2 = BN_dup(r->p);
      dh->length = (long)pBVar2;
      if (pBVar2 == (BIGNUM *)0x0) goto LAB_0031c515;
    }
    if (r->q != (BIGNUM *)0x0) {
      pBVar2 = BN_dup(r->q);
      dh->pub_key = pBVar2;
      if (pBVar2 == (BIGNUM *)0x0) goto LAB_0031c515;
    }
    pDVar3 = dh;
    dh = (DH *)0x0;
  }
  if (dh != (DH *)0x0) {
    DH_free(dh);
  }
  return pDVar3;
}

Assistant:

DH *DSA_dup_DH(const DSA *dsa) {
  if (dsa == nullptr) {
    return nullptr;
  }

  bssl::UniquePtr<DH> ret(DH_new());
  if (ret == nullptr) {
    return nullptr;
  }
  if (dsa->q != nullptr) {
    ret->priv_length = BN_num_bits(dsa->q);
    if ((ret->q = BN_dup(dsa->q)) == nullptr) {
      return nullptr;
    }
  }
  if ((dsa->p != nullptr && (ret->p = BN_dup(dsa->p)) == nullptr) ||
      (dsa->g != nullptr && (ret->g = BN_dup(dsa->g)) == nullptr) ||
      (dsa->pub_key != nullptr &&
       (ret->pub_key = BN_dup(dsa->pub_key)) == nullptr) ||
      (dsa->priv_key != nullptr &&
       (ret->priv_key = BN_dup(dsa->priv_key)) == nullptr)) {
    return nullptr;
  }

  return ret.release();
}